

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket_service.hpp
# Opt level: O1

int __thiscall
asio::stream_socket_service<asio::ip::tcp>::close
          (stream_socket_service<asio::ip::tcp> *this,int __fd)

{
  int *in_RDX;
  undefined4 in_register_00000034;
  int *piVar1;
  
  piVar1 = (int *)CONCAT44(in_register_00000034,__fd);
  if (*piVar1 != -1) {
    detail::epoll_reactor::deregister_descriptor
              ((this->service_impl_).super_reactive_socket_service_base.reactor_,*piVar1,
               (per_descriptor_data *)(piVar1 + 2),(*(byte *)(piVar1 + 1) & 0x40) == 0);
  }
  detail::socket_ops::close(*piVar1);
  *piVar1 = -1;
  *(undefined1 *)(piVar1 + 1) = 0;
  return *in_RDX;
}

Assistant:

asio::error_code close(implementation_type& impl,
      asio::error_code& ec)
  {
    return service_impl_.close(impl, ec);
  }